

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_helpers_qpromiseall.cpp
# Opt level: O0

void __thiscall
tst_deprecations_helpers_qpromiseall::preserveOrder(tst_deprecations_helpers_qpromiseall *this)

{
  initializer_list<int> args;
  initializer_list<QtPromise::QPromise<int>_> args_00;
  bool bVar1;
  QPromise<int> *local_198;
  bool local_182;
  bool local_181;
  bool local_180;
  bool local_17f;
  bool local_17e;
  bool local_17d;
  int local_17c [3];
  iterator local_170;
  undefined8 local_168;
  QList<int> local_160;
  QList<int> local_148;
  QList<int> local_130;
  bool local_116;
  bool local_115;
  bool local_114;
  bool local_113;
  bool local_112;
  bool local_111 [7];
  bool local_10a;
  bool local_109;
  QPromise<int> *local_108;
  QPromise<int> local_100;
  QPromise<int> local_f0;
  QPromise<int> local_e0;
  QPromise<int> local_d0;
  QList<QtPromise::QPromise<int>_> local_c0;
  undefined1 local_a8 [8];
  QPromise<QList<int>_> p;
  QPromise<int> local_90;
  undefined1 local_80 [8];
  QPromise<int> p2;
  QPromise<int> local_68;
  undefined1 local_58 [8];
  QPromise<int> p1;
  int local_34;
  QPromise<int> local_30;
  undefined1 local_20 [8];
  QPromise<int> p0;
  tst_deprecations_helpers_qpromiseall *this_local;
  
  local_34 = 0x2a;
  p0.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)this;
  QtPromise::resolve<int>((QtPromise *)&local_30,&local_34);
  QtPromise::QPromiseBase<int>::delay((QPromiseBase<int> *)local_20,(int)(QtPromise *)&local_30);
  QtPromise::QPromise<int>::~QPromise(&local_30);
  p2.super_QPromiseBase<int>.m_d.d._4_4_ = 0x2b;
  QtPromise::resolve<int>
            ((QtPromise *)&local_68,(int *)((long)&p2.super_QPromiseBase<int>.m_d.d + 4));
  QtPromise::QPromiseBase<int>::delay((QPromiseBase<int> *)local_58,(int)&local_68);
  QtPromise::QPromise<int>::~QPromise(&local_68);
  p.super_QPromiseBase<QList<int>_>.m_d.d._4_4_ = 0x2c;
  QtPromise::resolve<int>
            ((QtPromise *)&local_90,(int *)((long)&p.super_QPromiseBase<QList<int>_>.m_d.d + 4));
  QtPromise::QPromiseBase<int>::delay((QPromiseBase<int> *)local_80,(int)&local_90);
  QtPromise::QPromise<int>::~QPromise(&local_90);
  local_108 = &local_100;
  QtPromise::QPromise<int>::QPromise<QtPromise::QPromise<int>&>(local_108,(QPromise<int> *)local_20)
  ;
  local_108 = &local_f0;
  QtPromise::QPromise<int>::QPromise<QtPromise::QPromise<int>&>(local_108,(QPromise<int> *)local_58)
  ;
  local_108 = &local_e0;
  QtPromise::QPromise<int>::QPromise<QtPromise::QPromise<int>&>(local_108,(QPromise<int> *)local_80)
  ;
  local_d0.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&local_100;
  local_d0.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)0x3;
  args_00._M_len = 3;
  args_00._M_array = (iterator)local_d0.super_QPromiseBase<int>._vptr_QPromiseBase;
  QList<QtPromise::QPromise<int>_>::QList(&local_c0,args_00);
  QtPromise::qPromiseAll<QList<QtPromise::QPromise<int>>>((QtPromise *)local_a8,&local_c0);
  QList<QtPromise::QPromise<int>_>::~QList(&local_c0);
  local_198 = &local_d0;
  do {
    local_198 = local_198 + -1;
    QtPromise::QPromise<int>::~QPromise(local_198);
  } while (local_198 != &local_100);
  local_109 = QtPromise::QPromiseBase<int>::isPending((QPromiseBase<int> *)local_20);
  local_10a = true;
  bVar1 = QTest::qCompare<bool,bool>
                    (&local_109,&local_10a,"p0.isPending()","true",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                     ,0xbf);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_111[0] = QtPromise::QPromiseBase<int>::isPending((QPromiseBase<int> *)local_58);
    local_112 = true;
    bVar1 = QTest::qCompare<bool,bool>
                      (local_111,&local_112,"p1.isPending()","true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                       ,0xc0);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      local_113 = QtPromise::QPromiseBase<int>::isPending((QPromiseBase<int> *)local_80);
      local_114 = true;
      bVar1 = QTest::qCompare<bool,bool>
                        (&local_113,&local_114,"p2.isPending()","true",
                         "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                         ,0xc1);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        local_115 = QtPromise::QPromiseBase<QList<int>_>::isPending
                              ((QPromiseBase<QList<int>_> *)local_a8);
        local_116 = true;
        bVar1 = QTest::qCompare<bool,bool>
                          (&local_115,&local_116,"p.isPending()","true",
                           "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                           ,0xc2);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          local_148.d.d = (Data *)0x0;
          local_148.d.ptr = (int *)0x0;
          local_148.d.size = 0;
          QList<int>::QList(&local_148);
          waitForValue<QList<int>>(&local_130,(QPromise<QList<int>_> *)local_a8,&local_148);
          local_17c[0] = 0x2a;
          local_17c[1] = 0x2b;
          local_17c[2] = 0x2c;
          local_170 = local_17c;
          local_168 = 3;
          args._M_len = 3;
          args._M_array = local_170;
          QList<int>::QList(&local_160,args);
          bVar1 = QTest::qCompare<int>
                            (&local_130,&local_160,"waitForValue(p, QVector<int>{})",
                             "(QVector<int>{42, 43, 44})",
                             "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                             ,0xc3);
          QList<int>::~QList(&local_160);
          QList<int>::~QList(&local_130);
          QList<int>::~QList(&local_148);
          if (((bVar1 ^ 0xffU) & 1) == 0) {
            local_17d = QtPromise::QPromiseBase<int>::isFulfilled((QPromiseBase<int> *)local_20);
            local_17e = true;
            bVar1 = QTest::qCompare<bool,bool>
                              (&local_17d,&local_17e,"p0.isFulfilled()","true",
                               "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                               ,0xc4);
            if (((bVar1 ^ 0xffU) & 1) == 0) {
              local_17f = QtPromise::QPromiseBase<int>::isFulfilled((QPromiseBase<int> *)local_58);
              local_180 = true;
              bVar1 = QTest::qCompare<bool,bool>
                                (&local_17f,&local_180,"p1.isFulfilled()","true",
                                 "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                                 ,0xc5);
              if (((bVar1 ^ 0xffU) & 1) == 0) {
                local_181 = QtPromise::QPromiseBase<int>::isFulfilled((QPromiseBase<int> *)local_80)
                ;
                local_182 = true;
                bVar1 = QTest::qCompare<bool,bool>
                                  (&local_181,&local_182,"p2.isFulfilled()","true",
                                   "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                                   ,0xc6);
                if (((bVar1 ^ 0xffU) & 1) == 0) {
                  local_111[1] = false;
                  local_111[2] = false;
                  local_111[3] = false;
                  local_111[4] = false;
                }
                else {
                  local_111[1] = true;
                  local_111[2] = false;
                  local_111[3] = false;
                  local_111[4] = false;
                }
              }
              else {
                local_111[1] = true;
                local_111[2] = false;
                local_111[3] = false;
                local_111[4] = false;
              }
            }
            else {
              local_111[1] = true;
              local_111[2] = false;
              local_111[3] = false;
              local_111[4] = false;
            }
          }
          else {
            local_111[1] = true;
            local_111[2] = false;
            local_111[3] = false;
            local_111[4] = false;
          }
        }
        else {
          local_111[1] = true;
          local_111[2] = false;
          local_111[3] = false;
          local_111[4] = false;
        }
      }
      else {
        local_111[1] = true;
        local_111[2] = false;
        local_111[3] = false;
        local_111[4] = false;
      }
    }
    else {
      local_111[1] = true;
      local_111[2] = false;
      local_111[3] = false;
      local_111[4] = false;
    }
  }
  else {
    local_111[1] = true;
    local_111[2] = false;
    local_111[3] = false;
    local_111[4] = false;
  }
  QtPromise::QPromise<QList<int>_>::~QPromise((QPromise<QList<int>_> *)local_a8);
  QtPromise::QPromise<int>::~QPromise((QPromise<int> *)local_80);
  QtPromise::QPromise<int>::~QPromise((QPromise<int> *)local_58);
  QtPromise::QPromise<int>::~QPromise((QPromise<int> *)local_20);
  return;
}

Assistant:

void tst_deprecations_helpers_qpromiseall::preserveOrder()
{
    auto p0 = QtPromise::resolve(42).delay(500);
    auto p1 = QtPromise::resolve(43).delay(100);
    auto p2 = QtPromise::resolve(44).delay(250);

    auto p = QtPromise::qPromiseAll(QVector<QtPromise::QPromise<int>>{p0, p1, p2});

    Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<QVector<int>>>::value));
    QCOMPARE(p0.isPending(), true);
    QCOMPARE(p1.isPending(), true);
    QCOMPARE(p2.isPending(), true);
    QCOMPARE(p.isPending(), true);
    QCOMPARE(waitForValue(p, QVector<int>{}), (QVector<int>{42, 43, 44}));
    QCOMPARE(p0.isFulfilled(), true);
    QCOMPARE(p1.isFulfilled(), true);
    QCOMPARE(p2.isFulfilled(), true);
}